

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall ON_TextMask::ContentHash(ON_TextMask *this)

{
  ON_SHA1_Hash *this_00;
  MaskType MVar1;
  MaskFrame MVar2;
  bool bVar3;
  uint u;
  ON_SHA1_Hash local_bc;
  ON_SHA1 local_a8;
  
  this_00 = &this->m_content_hash;
  bVar3 = ON_SHA1_Hash::IsZeroDigest(this_00);
  if (bVar3) {
    local_a8.m_state[2] = 0;
    local_a8.m_state[3] = 0;
    local_a8.m_state[4] = 0;
    local_a8.m_bit_count[0] = 0;
    local_a8.m_bit_count[1] = 0;
    local_a8.m_state[0] = 0;
    local_a8.m_state[1] = 0;
    local_a8.m_buffer[0x30] = '\0';
    local_a8.m_buffer[0x31] = '\0';
    local_a8.m_buffer[0x32] = '\0';
    local_a8.m_buffer[0x33] = '\0';
    local_a8.m_buffer[0x34] = '\0';
    local_a8.m_buffer[0x35] = '\0';
    local_a8.m_buffer[0x36] = '\0';
    local_a8.m_buffer[0x37] = '\0';
    local_a8.m_buffer[0x38] = '\0';
    local_a8.m_buffer[0x39] = '\0';
    local_a8.m_buffer[0x3a] = '\0';
    local_a8.m_buffer[0x3b] = '\0';
    local_a8.m_buffer[0x3c] = '\0';
    local_a8.m_buffer[0x3d] = '\0';
    local_a8.m_buffer[0x3e] = '\0';
    local_a8.m_buffer[0x3f] = '\0';
    local_a8.m_buffer[0x20] = '\0';
    local_a8.m_buffer[0x21] = '\0';
    local_a8.m_buffer[0x22] = '\0';
    local_a8.m_buffer[0x23] = '\0';
    local_a8.m_buffer[0x24] = '\0';
    local_a8.m_buffer[0x25] = '\0';
    local_a8.m_buffer[0x26] = '\0';
    local_a8.m_buffer[0x27] = '\0';
    local_a8.m_buffer[0x28] = '\0';
    local_a8.m_buffer[0x29] = '\0';
    local_a8.m_buffer[0x2a] = '\0';
    local_a8.m_buffer[0x2b] = '\0';
    local_a8.m_buffer[0x2c] = '\0';
    local_a8.m_buffer[0x2d] = '\0';
    local_a8.m_buffer[0x2e] = '\0';
    local_a8.m_buffer[0x2f] = '\0';
    local_a8.m_buffer[0x10] = '\0';
    local_a8.m_buffer[0x11] = '\0';
    local_a8.m_buffer[0x12] = '\0';
    local_a8.m_buffer[0x13] = '\0';
    local_a8.m_buffer[0x14] = '\0';
    local_a8.m_buffer[0x15] = '\0';
    local_a8.m_buffer[0x16] = '\0';
    local_a8.m_buffer[0x17] = '\0';
    local_a8.m_buffer[0x18] = '\0';
    local_a8.m_buffer[0x19] = '\0';
    local_a8.m_buffer[0x1a] = '\0';
    local_a8.m_buffer[0x1b] = '\0';
    local_a8.m_buffer[0x1c] = '\0';
    local_a8.m_buffer[0x1d] = '\0';
    local_a8.m_buffer[0x1e] = '\0';
    local_a8.m_buffer[0x1f] = '\0';
    local_a8.m_buffer[0] = '\0';
    local_a8.m_buffer[1] = '\0';
    local_a8.m_buffer[2] = '\0';
    local_a8.m_buffer[3] = '\0';
    local_a8.m_buffer[4] = '\0';
    local_a8.m_buffer[5] = '\0';
    local_a8.m_buffer[6] = '\0';
    local_a8.m_buffer[7] = '\0';
    local_a8.m_buffer[8] = '\0';
    local_a8.m_buffer[9] = '\0';
    local_a8.m_buffer[10] = '\0';
    local_a8.m_buffer[0xb] = '\0';
    local_a8.m_buffer[0xc] = '\0';
    local_a8.m_buffer[0xd] = '\0';
    local_a8.m_buffer[0xe] = '\0';
    local_a8.m_buffer[0xf] = '\0';
    local_a8.m_byte_count = 0;
    local_a8.m_status_bits = 0;
    local_a8.m_reserved = 0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_a8.m_sha1_hash);
    MVar1 = this->m_mask_type;
    MVar2 = this->m_mask_frame;
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_bDrawMask);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)MVar1);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)MVar2);
    u = ON_Color::operator_cast_to_unsigned_int(&this->m_mask_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,u);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_mask_border);
    ON_SHA1::Hash(&local_bc,&local_a8);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) = local_bc.m_digest._16_4_;
    *(undefined8 *)this_00->m_digest = local_bc.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = local_bc.m_digest._8_8_;
  }
  return this_00;
}

Assistant:

const ON_SHA1_Hash& ON_TextMask::ContentHash() const
{
  if (m_content_hash.IsZeroDigest())
  {
    ON_SHA1 sha1;
    unsigned int u[3] = {
      (m_bDrawMask ? 1U : 0U),
      (unsigned int)(static_cast<unsigned char>(m_mask_type)),
      (unsigned int)(static_cast<unsigned char>(m_mask_frame))
    };
    sha1.AccumulateUnsigned32(u[0]);
    sha1.AccumulateUnsigned32(u[1]);
    sha1.AccumulateUnsigned32(u[2]);
    sha1.AccumulateUnsigned32(m_mask_color);
    sha1.AccumulateDouble(m_mask_border);
    m_content_hash = sha1.Hash();
  }
  return m_content_hash;
}